

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

Element * __thiscall
Rml::Context::GetElementAtPoint
          (Context *this,Vector2f point,Element *ignore_element,Element *element)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Element *element_hierarchy;
  Element *this_00;
  ElementDocument *this_01;
  Element *pEVar5;
  ComputedValues *pCVar6;
  undefined4 uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  Rectanglei clip_region;
  ElementDocument *local_68;
  Vector2f local_60;
  Rectanglei local_58;
  Vector2f local_48;
  
  pEVar5 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  local_60 = point;
  local_48 = point;
  if (element == (Element *)0x0) {
    element = pEVar5;
    if (pEVar5 == ignore_element) {
      return (Element *)0x0;
    }
LAB_00258ec9:
    if ((this->focus != (Element *)0x0) &&
       (local_68 = Element::GetOwnerDocument(this->focus), local_68 != (ElementDocument *)0x0)) {
      bVar3 = ElementDocument::IsModal(local_68);
      goto LAB_00258f01;
    }
  }
  else if (pEVar5 == element) goto LAB_00258ec9;
  local_68 = (ElementDocument *)0x0;
  bVar3 = false;
LAB_00258f01:
  if (element->local_stacking_context != true) {
LAB_00258fbb:
    pCVar6 = Element::GetComputedValues(element);
    if (((((pCVar6->inherited).field_0x15 & 0x20) != 0) &&
        (bVar3 = Element::Project(element,&local_60), bVar3)) &&
       (iVar4 = (*(element->super_ScriptInterface).super_Releasable._vptr_Releasable[7])
                          (local_60,element), (char)iVar4 != '\0')) {
      local_58.p0.x = 0;
      local_58.p0.y = 0;
      local_58.p1.x = 0;
      local_58.p1.y = 0;
      uVar7 = 0;
      bVar3 = ElementUtilities::GetClippingRegion
                        (element,&local_58,(ClipMaskGeometryList *)0x0,false);
      if (!bVar3) {
        return element;
      }
      auVar9._0_4_ = -(uint)((int)local_60.x < local_58.p0.x);
      iVar4 = -(uint)((int)local_60.y < local_58.p0.y);
      auVar9._4_4_ = auVar9._0_4_;
      auVar9._8_4_ = iVar4;
      auVar9._12_4_ = iVar4;
      uVar7 = movmskpd(uVar7,auVar9);
      if ((((local_58.p1.x < (int)local_60.x | (byte)uVar7 | (byte)uVar7 >> 1) & 1) == 0) &&
         ((int)local_60.y <= local_58.p1.y)) {
        return element;
      }
    }
    return (Element *)0x0;
  }
  if (element->stacking_context_dirty == true) {
    Element::BuildLocalStackingContext(element);
  }
  uVar8 = (ulong)((long)(element->stacking_context).
                        super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(element->stacking_context).
                       super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
LAB_00258f2d:
  do {
    if ((int)uVar8 < 1) goto LAB_00258fbb;
    uVar1 = uVar8 - 1;
    pEVar5 = (element->stacking_context).
             super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8 + 0xffffffffffffffff];
    this_00 = pEVar5;
    uVar8 = uVar1;
    if (ignore_element != (Element *)0x0) {
      for (; (this_00 != (Element *)0x0 && (this_00 != ignore_element));
          this_00 = Element::GetParentNode(this_00)) {
      }
      if (this_00 != (Element *)0x0) goto LAB_00258f2d;
    }
    if (((bVar3 == false) ||
        ((this_01 = Element::GetOwnerDocument(pEVar5), this_01 != (ElementDocument *)0x0 &&
         ((this_01 == local_68 || (bVar2 = ElementDocument::IsFocusableFromModal(this_01), bVar2))))
        )) && (pEVar5 = GetElementAtPoint(this,local_48,ignore_element,pEVar5),
              pEVar5 != (Element *)0x0)) {
      return pEVar5;
    }
  } while( true );
}

Assistant:

Element* Context::GetElementAtPoint(Vector2f point, const Element* ignore_element, Element* element) const
{
	if (!element)
	{
		if (ignore_element == root.get())
			return nullptr;

		element = root.get();
	}

	bool is_modal = false;
	ElementDocument* focus_document = nullptr;

	// If we have modal focus, only check down documents that can receive focus from modals.
	if (element == root.get() && focus)
	{
		focus_document = focus->GetOwnerDocument();
		if (focus_document && focus_document->IsModal())
			is_modal = true;
	}

	// Check any elements within our stacking context. We want to return the lowest-down element
	// that is under the cursor.
	if (element->local_stacking_context)
	{
		if (element->stacking_context_dirty)
			element->BuildLocalStackingContext();

		for (int i = (int)element->stacking_context.size() - 1; i >= 0; --i)
		{
			Element* stacking_child = element->stacking_context[i];
			if (ignore_element)
			{
				// Check if the element is a descendant of the element we're ignoring.
				Element* element_hierarchy = stacking_child;
				while (element_hierarchy)
				{
					if (element_hierarchy == ignore_element)
						break;

					element_hierarchy = element_hierarchy->GetParentNode();
				}

				if (element_hierarchy)
					continue;
			}

			if (is_modal)
			{
				ElementDocument* child_document = stacking_child->GetOwnerDocument();
				if (!child_document || !(child_document == focus_document || child_document->IsFocusableFromModal()))
					continue;
			}

			Element* child_element = GetElementAtPoint(point, ignore_element, stacking_child);
			if (child_element)
				return child_element;
		}
	}

	// Ignore elements whose pointer events are disabled.
	if (element->GetComputedValues().pointer_events() == Style::PointerEvents::None)
		return nullptr;

	// Projection may fail if we have a singular transformation matrix.
	bool projection_result = element->Project(point);

	// Check if the point is actually within this element.
	bool within_element = (projection_result && element->IsPointWithinElement(point));
	if (within_element)
	{
		// The element may have been clipped out of view if it overflows an ancestor, so check its clipping region.
		Rectanglei clip_region;
		if (ElementUtilities::GetClippingRegion(element, clip_region))
			within_element = clip_region.Contains(Vector2i(point));
	}

	if (within_element)
		return element;

	return nullptr;
}